

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Uint64
          (Hasher<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,uint64_t u)

{
  bool bVar1;
  undefined1 auVar2 [16];
  Number n;
  U local_10;
  double local_8;
  
  auVar2._8_4_ = (int)(u >> 0x20);
  auVar2._0_8_ = u;
  auVar2._12_4_ = 0x45300000;
  local_8 = (auVar2._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)u) - 4503599627370496.0);
  local_10.u = u;
  bVar1 = WriteNumber(this,(Number *)&local_10);
  return bVar1;
}

Assistant:

bool Uint64(uint64_t u) { Number n; n.u.u = u; n.d = static_cast<double>(u); return WriteNumber(n); }